

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PathIntegrator::SampleLd
          (PathIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler)

{
  Vector3f *pVVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  ulong uVar5;
  undefined1 auVar7 [16];
  Vector3f wiRender;
  Interaction *pIVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  SampledLight *pSVar12;
  LightLiSample *pLVar13;
  optional<pbrt::LightLiSample> *w;
  Float FVar14;
  Point2f PVar15;
  type a;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 extraout_var [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined8 uVar23;
  undefined1 extraout_var_00 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar25 [16];
  undefined1 auVar31 [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  Vector3<float> VVar32;
  Point3f PVar33;
  Vector3f woRender;
  Vector3f woRender_00;
  SampledSpectrum SVar34;
  DispatchSplit<9> local_1b9;
  float local_1b8;
  float fStack_1b4;
  undefined8 uStack_1b0;
  float local_19c;
  Vector3f wi;
  undefined8 local_188;
  undefined1 local_178 [16];
  SampledSpectrum *pSStack_168;
  undefined4 *puStack_160;
  array<float,_4> local_158;
  Interval IStack_148;
  Tuple3<pbrt::Normal3,_float> TStack_140;
  float local_134;
  float fStack_130;
  float local_12c;
  optional<pbrt::SampledLight> sampledLight;
  undefined4 local_10c;
  undefined8 local_108;
  optional<pbrt::LightLiSample> ls;
  SampledSpectrum f;
  SampledSpectrum local_58;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar18 [64];
  undefined1 auVar24 [56];
  undefined1 auVar26 [64];
  
  IStack_148 = (intr->super_Interaction).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  pIVar8 = &intr->super_Interaction;
  local_158.values[0] =
       (pIVar8->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  local_158.values[1] =
       (pIVar8->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  local_158.values[2] =
       (pIVar8->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  local_158.values[3] =
       (pIVar8->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar24 = ZEXT856((ulong)(intr->super_Interaction).pi.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  TStack_140.x = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  TStack_140.y = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  TStack_140.z = (intr->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar4 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar6 = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_12c = (intr->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_134 = (float)uVar4;
  fStack_130 = (float)uVar6;
  bVar11 = BSDF::HasReflection(bsdf);
  if (bVar11) {
    bVar11 = BSDF::HasTransmission(bsdf);
    if (bVar11) goto LAB_004113f7;
    w = (optional<pbrt::LightLiSample> *)&(intr->super_Interaction).wo;
LAB_0041142f:
    PVar33 = Interaction::OffsetRayOrigin(&intr->super_Interaction,(Vector3f *)w);
    auVar25._0_4_ = PVar33.super_Tuple3<pbrt::Point3,_float>.z;
    auVar17._0_8_ = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar17._8_56_ = auVar24;
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    local_158.values = (float  [4])vshufps_avx(auVar17._0_16_,auVar17._0_16_,0x50);
    IStack_148 = (Interval)vmovlps_avx(auVar25);
  }
  else {
LAB_004113f7:
    bVar11 = BSDF::HasTransmission(bsdf);
    if (bVar11) {
      bVar11 = BSDF::HasReflection(bsdf);
      if (!bVar11) {
        VVar32 = Tuple3<pbrt::Vector3,_float>::operator-
                           (&(intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>);
        ls.optionalValue._8_4_ = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar16._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar16._8_56_ = auVar24;
        w = &ls;
        ls.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar16._0_16_)
        ;
        goto LAB_0041142f;
      }
    }
  }
  FVar14 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  LightSamplerHandle::Sample
            (&sampledLight,&this->lightSampler,(LightSampleContext *)&local_158,FVar14);
  PVar15 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  local_1b8 = PVar15.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_1b4 = PVar15.super_Tuple2<pbrt::Point2,_float>.y;
  uStack_1b0 = 0;
  local_188 = 0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  if (sampledLight.set == false) goto LAB_00411715;
  uStack_1b0 = extraout_XMM0_Qb;
  pSVar12 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
  uVar5 = (pSVar12->light).
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits;
  pSStack_168 = &local_58;
  puStack_160 = &local_10c;
  f.values.values = (array<float,_4>)(array<float,_4>)local_158.values;
  local_58.values.values = *(array<float,_4> *)(lambda->lambda).values;
  uStack_48 = *(undefined8 *)(lambda->pdf).values;
  uStack_40 = *(undefined8 *)((lambda->pdf).values + 2);
  local_10c = 0;
  local_178._8_8_ = &local_108;
  local_178._0_8_ = &f;
  auVar7._4_4_ = fStack_1b4;
  auVar7._0_4_ = local_1b8;
  auVar7._8_8_ = uStack_1b0;
  local_108 = vmovlps_avx(auVar7);
  wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar5;
  DispatchSplit<9>::operator()(&ls,&local_1b9,&wi,uVar5 >> 0x30);
  local_1b8 = 0.0;
  fStack_1b4 = 0.0;
  uStack_1b0 = 0;
  if (ls.set == true) {
    pLVar13 = pstd::optional<pbrt::LightLiSample>::value(&ls);
    bVar11 = SampledSpectrum::operator_cast_to_bool(&pLVar13->L);
    if (!bVar11) goto LAB_004116f8;
    pLVar13 = pstd::optional<pbrt::LightLiSample>::value(&ls);
    local_188 = 0;
    if ((pLVar13->pdf != 0.0) || (NAN(pLVar13->pdf))) {
      uVar2 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar3 = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar3;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
      local_19c = (intr->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      pLVar13 = pstd::optional<pbrt::LightLiSample>::value(&ls);
      wi.super_Tuple3<pbrt::Vector3,_float>.z = (pLVar13->wi).super_Tuple3<pbrt::Vector3,_float>.z;
      pVVar1 = &pLVar13->wi;
      wi.super_Tuple3<pbrt::Vector3,_float>.x = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
      wi.super_Tuple3<pbrt::Vector3,_float>.y = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
      woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_19c;
      woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
      woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar3;
      auVar31 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar24 = ZEXT856(0);
      SVar34 = BSDF::f(bsdf,woRender,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,Radiance);
      auVar26._0_8_ = SVar34.values.values._8_8_;
      auVar26._8_56_ = auVar31;
      auVar18._0_8_ = SVar34.values.values._0_8_;
      auVar18._8_56_ = auVar24;
      local_178 = vmovlhps_avx(auVar18._0_16_,auVar26._0_16_);
      a = AbsDot<float>(&wi,&(intr->shading).n);
      auVar24 = extraout_var;
      SVar34 = SampledSpectrum::operator*((SampledSpectrum *)local_178,a);
      auVar27._0_8_ = SVar34.values.values._8_8_;
      auVar27._8_56_ = auVar31;
      auVar19._0_8_ = SVar34.values.values._0_8_;
      auVar19._8_56_ = auVar24;
      f.values.values = (array<float,_4>)vmovlhps_avx(auVar19._0_16_,auVar27._0_16_);
      bVar11 = SampledSpectrum::operator_cast_to_bool(&f);
      local_1b8 = 0.0;
      fStack_1b4 = 0.0;
      uStack_1b0 = 0;
      if (!bVar11) goto LAB_004116f8;
      pLVar13 = pstd::optional<pbrt::LightLiSample>::value(&ls);
      bVar11 = Integrator::Unoccluded((Integrator *)this,&intr->super_Interaction,&pLVar13->pLight);
      local_188 = 0;
      auVar24 = ZEXT856(0);
      if (bVar11) {
        pSVar12 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
        local_1b8 = pSVar12->pdf;
        pLVar13 = pstd::optional<pbrt::LightLiSample>::value(&ls);
        local_1b8 = local_1b8 * pLVar13->pdf;
        auVar31 = (undefined1  [56])0x0;
        if (*(uint *)(uVar5 & 0xffffffffffff) < 2) {
          pLVar13 = pstd::optional<pbrt::LightLiSample>::value(&ls);
          SVar34 = SampledSpectrum::operator*(&f,&pLVar13->L);
          auVar28._0_8_ = SVar34.values.values._8_8_;
          auVar28._8_56_ = auVar24;
          auVar20._0_8_ = SVar34.values.values._0_8_;
          auVar20._8_56_ = auVar31;
          local_178 = vmovlhps_avx(auVar20._0_16_,auVar28._0_16_);
          uVar23 = 0;
          SVar34 = SampledSpectrum::operator/((SampledSpectrum *)local_178,local_1b8);
          local_188 = SVar34.values.values._8_8_;
          local_1b8 = SVar34.values.values[0];
          fStack_1b4 = SVar34.values.values[1];
          uStack_1b0 = uVar23;
        }
        else {
          wiRender.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.x = wi.super_Tuple3<pbrt::Vector3,_float>.x;
          wiRender.super_Tuple3<pbrt::Vector3,_float>.y = wi.super_Tuple3<pbrt::Vector3,_float>.y;
          woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_19c;
          auVar31 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
          FVar14 = BSDF::PDF(bsdf,woRender_00,wiRender,Radiance,All);
          auVar24 = extraout_var_00;
          pLVar13 = pstd::optional<pbrt::LightLiSample>::value(&ls);
          SVar34 = SampledSpectrum::operator*(&f,&pLVar13->L);
          auVar29._0_8_ = SVar34.values.values._8_8_;
          auVar29._8_56_ = auVar31;
          auVar21._0_8_ = SVar34.values.values._0_8_;
          auVar21._8_56_ = auVar24;
          local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar21._0_16_,auVar29._0_16_);
          auVar24 = ZEXT856(0);
          SVar34 = SampledSpectrum::operator*
                             (&local_58,
                              (local_1b8 * local_1b8) / (local_1b8 * local_1b8 + FVar14 * FVar14));
          auVar30._0_8_ = SVar34.values.values._8_8_;
          auVar30._8_56_ = auVar31;
          auVar22._0_8_ = SVar34.values.values._0_8_;
          auVar22._8_56_ = auVar24;
          local_178 = vmovlhps_avx(auVar22._0_16_,auVar30._0_16_);
          uVar23 = 0;
          SVar34 = SampledSpectrum::operator/((SampledSpectrum *)local_178,local_1b8);
          local_188 = SVar34.values.values._8_8_;
          local_1b8 = SVar34.values.values[0];
          fStack_1b4 = SVar34.values.values[1];
          uStack_1b0 = uVar23;
        }
      }
    }
  }
  else {
LAB_004116f8:
    local_188 = 0;
  }
  pstd::optional<pbrt::LightLiSample>::~optional(&ls);
  fVar9 = local_1b8;
  fVar10 = fStack_1b4;
LAB_00411715:
  fStack_1b4 = fVar10;
  local_1b8 = fVar9;
  pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  SVar34.values.values[1] = fStack_1b4;
  SVar34.values.values[0] = local_1b8;
  SVar34.values.values[2] = (float)(undefined4)local_188;
  SVar34.values.values[3] = (float)local_188._4_4_;
  return (SampledSpectrum)SVar34.values.values;
}

Assistant:

SampledSpectrum PathIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF *bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler) const {
    // Initialize _LightSampleContext_ for light sampling
    LightSampleContext ctx(intr);
    // Try to nudge the light sampling position to correct side of the surface
    if (bsdf->HasReflection() && !bsdf->HasTransmission())
        ctx.pi = intr.OffsetRayOrigin(intr.wo);
    else if (bsdf->HasTransmission() && !bsdf->HasReflection())
        ctx.pi = intr.OffsetRayOrigin(-intr.wo);

    // Choose a light source for the direct lighting calculation
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(ctx, sampler.Get1D());
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return {};

    // Sample a point on the light source for direct lighting
    LightHandle light = sampledLight->light;
    DCHECK(light != nullptr && sampledLight->pdf > 0);
    pstd::optional<LightLiSample> ls =
        light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls->L || ls->pdf == 0)
        return {};

    // Evaluate BSDF for light sample and check light visibility
    Vector3f wo = intr.wo, wi = ls->wi;
    SampledSpectrum f = bsdf->f(wo, wi) * AbsDot(wi, intr.shading.n);
    if (!f || !Unoccluded(intr, ls->pLight))
        return {};

    // Return light's contribution to reflected radiance
    Float lightPDF = sampledLight->pdf * ls->pdf;
    if (IsDeltaLight(light.Type()))
        return f * ls->L / lightPDF;
    else {
        Float bsdfPDF = bsdf->PDF(wo, wi);
        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
        return f * ls->L * weight / lightPDF;
    }
}